

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitDrop
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,Drop *curr,
          optional<unsigned_int> arity)

{
  if (((ulong)arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)wasm::Type::size(&curr->value->type);
  }
  if (((ulong)arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> & 0xfffffffe) != 0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyTupleType
              ((ConstraintCollector *)this,&curr->value,
               (ulong)arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> & 0xffffffff);
    return;
  }
  IRBuilder::ChildPopper::ConstraintCollector::noteAnyType((ConstraintCollector *)this,&curr->value)
  ;
  return;
}

Assistant:

void visitDrop(Drop* curr, std::optional<Index> arity = std::nullopt) {
    if (!arity) {
      arity = curr->value->type.size();
    }
    if (*arity > 1) {
      noteAnyTuple(&curr->value, *arity);
    } else {
      noteAny(&curr->value);
    }
  }